

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcWriteVer.c
# Opt level: O0

void Wlc_WriteAddPos(Wlc_Ntk_t *p)

{
  int iVar1;
  Wlc_Obj_t *pObj_00;
  int local_1c;
  int i;
  Wlc_Obj_t *pObj;
  Wlc_Ntk_t *p_local;
  
  Vec_IntClear(&p->vPos);
  for (local_1c = 1; iVar1 = Wlc_NtkObjNumMax(p), local_1c < iVar1; local_1c = local_1c + 1) {
    pObj_00 = Wlc_NtkObj(p,local_1c);
    if (((undefined1  [24])((undefined1  [24])*pObj_00 & (undefined1  [24])0x3f) !=
         (undefined1  [24])0x1) &&
       ((undefined1  [24])((undefined1  [24])*pObj_00 & (undefined1  [24])0x3f) !=
        (undefined1  [24])0x8)) {
      *(ushort *)pObj_00 = *(ushort *)pObj_00 & 0xfdff | 0x200;
      iVar1 = Wlc_ObjId(p,pObj_00);
      Vec_IntPush(&p->vPos,iVar1);
    }
  }
  return;
}

Assistant:

void Wlc_WriteAddPos( Wlc_Ntk_t * p )
{
    Wlc_Obj_t * pObj;
    int i;
    Vec_IntClear( &p->vPos );
    Wlc_NtkForEachObj( p, pObj, i )
        if ( pObj->Type != WLC_OBJ_PI && pObj->Type != WLC_OBJ_MUX )
        {
            pObj->fIsPo = 1;
            Vec_IntPush( &p->vPos, Wlc_ObjId(p, pObj) );
        }
}